

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# snappy.cc
# Opt level: O0

size_t duckdb_snappy::CompressFromIOVec
                 (iovec *iov,size_t iov_cnt,string *compressed,CompressionOptions options)

{
  undefined4 in_ECX;
  ulong in_RDX;
  ulong in_RSI;
  string *in_RDI;
  size_t unaff_retaddr;
  iovec *in_stack_00000008;
  CompressionOptions in_stack_00000014;
  size_t compressed_length;
  size_t i;
  size_t uncompressed_length;
  ulong new_size;
  string *in_stack_ffffffffffffffb0;
  ulong local_38;
  ulong local_30;
  size_t local_28;
  undefined4 in_stack_fffffffffffffff8;
  
  local_28 = 0;
  for (local_30 = 0; local_30 < in_RSI; local_30 = local_30 + 1) {
    local_28 = (&in_RDI->_M_string_length)[local_30 * 2] + local_28;
  }
  new_size = in_RDX;
  MaxCompressedLength(local_28);
  STLStringResizeUninitialized(in_stack_ffffffffffffffb0,new_size);
  string_as_array(in_RDI);
  RawCompressFromIOVec
            (in_stack_00000008,unaff_retaddr,(char *)CONCAT44(in_ECX,in_stack_fffffffffffffff8),
             (size_t *)in_RDI,in_stack_00000014);
  std::__cxx11::string::erase(in_RDX,local_38);
  return local_38;
}

Assistant:

size_t CompressFromIOVec(const struct iovec* iov, size_t iov_cnt,
                         std::string* compressed, CompressionOptions options) {
  // Compute the number of bytes to be compressed.
  size_t uncompressed_length = 0;
  for (size_t i = 0; i < iov_cnt; ++i) {
    uncompressed_length += iov[i].iov_len;
  }

  // Pre-grow the buffer to the max length of the compressed output.
  STLStringResizeUninitialized(compressed, MaxCompressedLength(
      uncompressed_length));

  size_t compressed_length;
  RawCompressFromIOVec(iov, uncompressed_length, string_as_array(compressed),
                       &compressed_length, options);
  compressed->erase(compressed_length);
  return compressed_length;
}